

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_dial(nng_socket sid,char *addr,nng_dialer *dp,int flags)

{
  int iVar1;
  uint32_t uVar2;
  nni_sock *local_38;
  nni_sock *s;
  nni_dialer *d;
  
  iVar1 = nni_sock_find(&local_38,sid.id);
  if (iVar1 == 0) {
    iVar1 = nni_dialer_create((nni_dialer **)&s,local_38,addr);
    if (iVar1 == 0) {
      iVar1 = nni_dialer_start((nni_dialer *)s,flags);
      if (iVar1 == 0) {
        if (dp != (nng_dialer *)0x0) {
          uVar2 = nni_dialer_id((nni_dialer *)s);
          dp->id = uVar2;
        }
        nni_dialer_rele((nni_dialer *)s);
        iVar1 = 0;
      }
      else {
        nni_dialer_close((nni_dialer *)s);
      }
    }
    else {
      nni_sock_rele(local_38);
    }
  }
  return iVar1;
}

Assistant:

int
nng_dial(nng_socket sid, const char *addr, nng_dialer *dp, int flags)
{
	nni_dialer *d;
	int         rv;
	nni_sock   *s;

	if ((rv = nni_sock_find(&s, sid.id)) != 0) {
		return (rv);
	}
	if ((rv = nni_dialer_create(&d, s, addr)) != 0) {
		nni_sock_rele(s);
		return (rv);
	}
	if ((rv = nni_dialer_start(d, flags)) != 0) {
		nni_dialer_close(d);
		return (rv);
	}
	if (dp != NULL) {
		nng_dialer did;
		did.id = nni_dialer_id(d);
		*dp    = did;
	}
	nni_dialer_rele(d);
	return (0);
}